

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O1

bool __thiscall
glslang::TSymbolTableLevel::findFunctionVariableName
          (TSymbolTableLevel *this,TString *name,bool *variable)

{
  _Base_ptr p_Var1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  size_type __n;
  bool bVar5;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  
  p_Var6 = &(this->level)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->level)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var6->_M_header;
  for (; p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[uVar2 >> 0x1f]) {
    uVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (p_Var1 + 1),name);
    if (-1 < (int)uVar2) {
      p_Var7 = p_Var1;
    }
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var6) {
LAB_0039e87b:
    bVar5 = false;
  }
  else {
    if (p_Var7[1]._M_left == (_Base_ptr)0x0) {
      __n = 0xffffffffffffffff;
    }
    else {
      p_Var1 = p_Var7[1]._M_parent;
      pvVar4 = memchr(p_Var1,0x28,(size_t)p_Var7[1]._M_left);
      __n = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)p_Var1;
    }
    if (__n == 0xffffffffffffffff) {
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)(p_Var7 + 1),name);
      if (iVar3 != 0) goto LAB_0039e87b;
      bVar5 = true;
    }
    else {
      bVar5 = false;
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)(p_Var7 + 1),0,__n,name);
      if (iVar3 != 0) {
        return false;
      }
    }
    *variable = bVar5;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool findFunctionVariableName(const TString& name, bool& variable) const
    {
        tLevel::const_iterator candidate = level.lower_bound(name);
        if (candidate != level.end()) {
            const TString& candidateName = (*candidate).first;
            TString::size_type parenAt = candidateName.find_first_of('(');
            if (parenAt == candidateName.npos) {
                // not a mangled name
                if (candidateName == name) {
                    // found a variable name match
                    variable = true;
                    return true;
                }
            } else {
                // a mangled name
                if (candidateName.compare(0, parenAt, name) == 0) {
                    // found a function name match
                    variable = false;
                    return true;
                }
            }
        }

        return false;
    }